

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::
insert<google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::const_iterator>
          (Map<std::__cxx11::string,google::protobuf::Value> *this,const_iterator first,
          const_iterator last)

{
  key_type *key;
  Value *this_00;
  undefined1 local_60 [8];
  iterator exist_it;
  const_iterator it;
  
  exist_it.it_.bucket_index_ = (size_type)first.it_.node_;
  while ((Node *)exist_it.it_.bucket_index_ != last.it_.node_) {
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ::find((iterator *)local_60,
           (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
            *)this,*(key_type **)(exist_it.it_.bucket_index_ + 8));
    if (local_60 == (undefined1  [8])0x0) {
      key = *(key_type **)(exist_it.it_.bucket_index_ + 8);
      this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                              *)this,key);
      Value::CopyFrom(this_00,(Value *)(key + 1));
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
    ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
                  *)&exist_it.it_.bucket_index_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }